

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O2

void __thiscall TileSwitch::updateOutput(TileSwitch *this)

{
  uint uVar1;
  Board *pBVar2;
  Vector2u *pVVar3;
  Tile *pTVar4;
  Vector2u local_20;
  
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  local_20 = (Vector2u)this;
  std::
  _Hashtable<TileSwitch_*,_TileSwitch_*,_std::allocator<TileSwitch_*>,_std::__detail::_Identity,_std::equal_to<TileSwitch_*>,_std::hash<TileSwitch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(pBVar2->switchUpdates)._M_h);
  pVVar3 = Tile::getPosition(&this->super_Tile);
  if (pVVar3->y != 0) {
    pBVar2 = Tile::getBoardPtr(&this->super_Tile);
    pVVar3 = Tile::getPosition(&this->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&this->super_Tile);
    local_20.y = pVVar3->y - 1;
    local_20.x = uVar1;
    pTVar4 = Board::getTile(pBVar2,&local_20);
    (*pTVar4->_vptr_Tile[9])(pTVar4,0,(ulong)*(uint *)&(this->super_Tile).field_0x24);
  }
  pVVar3 = Tile::getPosition(&this->super_Tile);
  uVar1 = pVVar3->x;
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  pVVar3 = Board::getSize(pBVar2);
  if (uVar1 < pVVar3->x - 1) {
    pBVar2 = Tile::getBoardPtr(&this->super_Tile);
    pVVar3 = Tile::getPosition(&this->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&this->super_Tile);
    local_20.y = pVVar3->y;
    local_20.x = uVar1 + 1;
    pTVar4 = Board::getTile(pBVar2,&local_20);
    (*pTVar4->_vptr_Tile[9])(pTVar4,1,(ulong)*(uint *)&(this->super_Tile).field_0x24);
  }
  pVVar3 = Tile::getPosition(&this->super_Tile);
  uVar1 = pVVar3->y;
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  pVVar3 = Board::getSize(pBVar2);
  if (uVar1 < pVVar3->y - 1) {
    pBVar2 = Tile::getBoardPtr(&this->super_Tile);
    pVVar3 = Tile::getPosition(&this->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&this->super_Tile);
    local_20.y = pVVar3->y + 1;
    local_20.x = uVar1;
    pTVar4 = Board::getTile(pBVar2,&local_20);
    (*pTVar4->_vptr_Tile[9])(pTVar4,2,(ulong)*(uint *)&(this->super_Tile).field_0x24);
  }
  pVVar3 = Tile::getPosition(&this->super_Tile);
  if (pVVar3->x != 0) {
    pBVar2 = Tile::getBoardPtr(&this->super_Tile);
    pVVar3 = Tile::getPosition(&this->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&this->super_Tile);
    local_20.y = pVVar3->y;
    local_20.x = uVar1 - 1;
    pTVar4 = Board::getTile(pBVar2,&local_20);
    (*pTVar4->_vptr_Tile[9])(pTVar4,3,(ulong)*(uint *)&(this->super_Tile).field_0x24);
  }
  return;
}

Assistant:

void TileSwitch::updateOutput() {
    getBoardPtr()->switchUpdates.erase(this);
    
    if (getPosition().y > 0) {    // Follow wire on all adjacent sides.
        getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->followWire(NORTH, _state);
    }
    if (getPosition().x < getBoardPtr()->getSize().x - 1) {
        getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->followWire(EAST, _state);
    }
    if (getPosition().y < getBoardPtr()->getSize().y - 1) {
        getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->followWire(SOUTH, _state);
    }
    if (getPosition().x > 0) {
        getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->followWire(WEST, _state);
    }
}